

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsIO.cpp
# Opt level: O0

string * highsFormatToString_abi_cxx11_(char *format,...)

{
  char in_AL;
  pointer pvVar1;
  size_type __maxlen;
  undefined8 in_RCX;
  undefined8 in_RDX;
  char *in_RSI;
  string *in_RDI;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  int len;
  array<char,_1024UL> msgbuffer;
  va_list argptr;
  undefined1 local_4f8 [16];
  undefined8 local_4e8;
  undefined8 local_4e0;
  undefined8 local_4d8;
  undefined8 local_4d0;
  undefined8 local_4c8;
  undefined8 local_4b8;
  undefined8 local_4a8;
  undefined8 local_498;
  undefined8 local_488;
  undefined8 local_478;
  undefined8 local_468;
  undefined8 local_458;
  allocator local_42d;
  int local_42c;
  array<char,_1024UL> local_428;
  undefined4 local_28;
  undefined4 local_24;
  undefined1 *local_20;
  undefined1 *local_18;
  char *local_10;
  string *local_8;
  
  if (in_AL != '\0') {
    local_4c8 = in_XMM0_Qa;
    local_4b8 = in_XMM1_Qa;
    local_4a8 = in_XMM2_Qa;
    local_498 = in_XMM3_Qa;
    local_488 = in_XMM4_Qa;
    local_478 = in_XMM5_Qa;
    local_468 = in_XMM6_Qa;
    local_458 = in_XMM7_Qa;
  }
  local_18 = local_4f8;
  local_20 = &stack0x00000008;
  local_24 = 0x30;
  local_28 = 0x10;
  local_4e8 = in_RDX;
  local_4e0 = in_RCX;
  local_4d8 = in_R8;
  local_4d0 = in_R9;
  local_10 = in_RSI;
  local_8 = in_RDI;
  memset(&local_428,0,0x400);
  pvVar1 = std::array<char,_1024UL>::data((array<char,_1024UL> *)0x45bf4b);
  __maxlen = std::array<char,_1024UL>::size(&local_428);
  local_42c = vsnprintf(pvVar1,__maxlen,local_10,&local_28);
  pvVar1 = std::array<char,_1024UL>::data((array<char,_1024UL> *)0x45bf88);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)in_RDI,pvVar1,&local_42d);
  std::allocator<char>::~allocator((allocator<char> *)&local_42d);
  return in_RDI;
}

Assistant:

std::string highsFormatToString(const char* format, ...) {
  va_list argptr;
  va_start(argptr, format);
  std::array<char, kIoBufferSize> msgbuffer = {};
  int len = vsnprintf(msgbuffer.data(), msgbuffer.size(), format, argptr);
  // assert that there are no encoding errors
  assert(len >= 0);
  va_end(argptr);
  return std::string(msgbuffer.data());
}